

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O2

SquareMatrix<2> pbrt::operator*(SquareMatrix<2> *m1,SquareMatrix<2> *m2)

{
  int i;
  long lVar1;
  Float *pFVar2;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  SquareMatrix<2> r;
  SquareMatrix<2> local_20;
  
  SquareMatrix<2>::SquareMatrix(&local_20);
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    pFVar2 = (Float *)m2;
    for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
      auVar5 = ZEXT816(0) << 0x40;
      for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
        auVar5 = vfmadd231ss_fma(auVar5,ZEXT416((uint)(*(Float (*) [2])*(Float (*) [2])m1)[lVar4]),
                                 ZEXT416((uint)pFVar2[lVar4 * 2]));
      }
      local_20.m[lVar1][lVar3] = auVar5._0_4_;
      pFVar2 = pFVar2 + 1;
    }
    m1 = (SquareMatrix<2> *)((long)m1 + 8);
  }
  return (SquareMatrix<2>)local_20.m;
}

Assistant:

PBRT_CPU_GPU inline SquareMatrix<N> operator*(const SquareMatrix<N> &m1,
                                              const SquareMatrix<N> &m2) {
    SquareMatrix<N> r;
    for (int i = 0; i < N; ++i)
        for (int j = 0; j < N; ++j) {
            r[i][j] = 0;
            for (int k = 0; k < N; ++k)
                r[i][j] = FMA(m1[i][k], m2[k][j], r[i][j]);
        }
    return r;
}